

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O0

Behavior * __thiscall
Lodtalk::StackInterpreter::getLookupClass(StackInterpreter *this,Oop receiver,bool superLookup)

{
  bool bVar1;
  int classIndex_00;
  Oop OVar2;
  Oop classOop;
  int classIndex;
  Behavior *behavior;
  Oop methodClass;
  bool superLookup_local;
  StackInterpreter *this_local;
  Oop receiver_local;
  
  if (superLookup) {
    OVar2 = CompiledMethod::getMethodClass(this->method);
    receiver_local.field_0 = *(anon_union_8_4_0eb573b0_for_Oop_0 *)((long)OVar2.field_0 + 8);
  }
  else {
    classIndex_00 = classIndexOf(receiver);
    receiver_local = VMContext::getClassFromIndex(this->context,classIndex_00);
    bVar1 = isNil(receiver_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!isNil(classOop)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackInterpreter.cpp"
                    ,0x231,"Behavior *Lodtalk::StackInterpreter::getLookupClass(Oop, bool)");
    }
  }
  return (Behavior *)receiver_local.field_0.pointer;
}

Assistant:

Behavior *getLookupClass(Oop receiver, bool superLookup)
    {
        if (superLookup)
        {
            auto methodClass = method->getMethodClass();
            auto behavior = reinterpret_cast<Behavior*> (methodClass.pointer);
            return behavior->superclass;
        }
        else
        {
            auto classIndex = classIndexOf(receiver);
            auto classOop = context->getClassFromIndex(classIndex);
            assert(!isNil(classOop));

            // Cast the class.
            return reinterpret_cast<Behavior*> (classOop.pointer);
        }
    }